

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_stroke_circle(nk_command_buffer *b,nk_rect r,float line_thickness,nk_color c)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  
  fVar2 = r.x;
  fVar3 = r.y;
  if ((0.0 < line_thickness) && (b != (nk_command_buffer *)0x0)) {
    fVar4 = r.w;
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      fVar7 = r.h;
      if (((fVar7 != 0.0) || (NAN(fVar7))) &&
         ((b->use_clipping == 0 ||
          ((((fVar5 = (b->clip).x, fVar5 <= fVar4 + fVar2 && (fVar2 <= fVar5 + (b->clip).w)) &&
            (fVar5 = (b->clip).y, fVar5 <= fVar3 + fVar7)) && (fVar3 <= fVar5 + (b->clip).h)))))) {
        pvVar1 = nk_command_buffer_push(b,NK_COMMAND_CIRCLE,0x20);
        if (pvVar1 != (void *)0x0) {
          fVar5 = 0.0;
          if (0.0 <= fVar4) {
            fVar5 = fVar4;
          }
          auVar8._8_4_ = line_thickness;
          auVar8._0_8_ = r._0_8_;
          auVar8._12_4_ = fVar5;
          auVar6._0_4_ = (int)fVar2;
          auVar6._4_4_ = (int)fVar3;
          auVar6._8_4_ = (int)line_thickness;
          auVar6._12_4_ = (int)fVar5;
          auVar8 = pshuflw(auVar8,auVar6,0xe8);
          auVar6 = pshufhw(auVar6,auVar6,0xe8);
          *(ulong *)((long)pvVar1 + 0x10) = CONCAT44(auVar6._8_4_,auVar8._0_4_);
          fVar2 = 0.0;
          if (0.0 <= fVar7) {
            fVar2 = fVar7;
          }
          *(short *)((long)pvVar1 + 0x18) = (short)(int)fVar2;
          *(nk_color *)((long)pvVar1 + 0x1a) = c;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_circle(struct nk_command_buffer *b, struct nk_rect r,
    float line_thickness, struct nk_color c)
{
    struct nk_command_circle *cmd;
    if (!b || r.w == 0 || r.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(r.x, r.y, r.w, r.h, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_circle*)
        nk_command_buffer_push(b, NK_COMMAND_CIRCLE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(r.w, 0);
    cmd->h = (unsigned short)NK_MAX(r.h, 0);
    cmd->color = c;
}